

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

_Bool GPU_SaveSurface(SDL_Surface *surface,char *filename,GPU_FileFormatEnum format)

{
  int y;
  void *data;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (((filename == (char *)0x0 || surface == (SDL_Surface *)0x0) || (iVar2 = surface->w, iVar2 < 1)
      ) || (y = surface->h, y < 1)) {
    return false;
  }
  if (GPU_FILE_TGA < format) {
    pcVar4 = "Unsupported output file format";
LAB_0015d1c2:
    GPU_PushErrorCode("GPU_SaveSurface",GPU_ERROR_DATA_ERROR,pcVar4);
    return false;
  }
  data = surface->pixels;
  switch(format) {
  case GPU_FILE_AUTO:
    pcVar3 = strrchr(filename,0x2e);
    pcVar4 = pcVar3 + 1;
    if (pcVar3 == filename) {
      pcVar4 = "";
    }
    if (pcVar3 == (char *)0x0) {
      pcVar4 = "";
    }
    iVar1 = gpu_strcasecmp(pcVar4,"png");
    if (iVar1 == 0) goto switchD_0015d0d9_caseD_1;
    iVar1 = gpu_strcasecmp(pcVar4,"bmp");
    if (iVar1 == 0) goto switchD_0015d0d9_caseD_2;
    iVar1 = gpu_strcasecmp(pcVar4,"tga");
    if (iVar1 != 0) {
      pcVar4 = "Could not detect output file format from file name";
      goto LAB_0015d1c2;
    }
  case GPU_FILE_TGA:
    iVar2 = stbi_write_tga(filename,iVar2,y,(uint)surface->format->BytesPerPixel,data);
    break;
  case GPU_FILE_PNG:
switchD_0015d0d9_caseD_1:
    iVar2 = stbi_write_png(filename,iVar2,y,(uint)surface->format->BytesPerPixel,data,0);
    break;
  case GPU_FILE_BMP:
switchD_0015d0d9_caseD_2:
    iVar2 = stbi_write_bmp(filename,iVar2,y,(uint)surface->format->BytesPerPixel,data);
  }
  return 0 < iVar2;
}

Assistant:

GPU_bool GPU_SaveSurface(SDL_Surface* surface, const char* filename, GPU_FileFormatEnum format)
{
    GPU_bool result;
    unsigned char* data;

    if(surface == NULL || filename == NULL ||
            surface->w < 1 || surface->h < 1)
    {
        return GPU_FALSE;
    }


    data = surface->pixels;

    if(format == GPU_FILE_AUTO)
    {
        const char* extension = get_filename_ext(filename);
        if(gpu_strcasecmp(extension, "png") == 0)
            format = GPU_FILE_PNG;
        else if(gpu_strcasecmp(extension, "bmp") == 0)
            format = GPU_FILE_BMP;
        else if(gpu_strcasecmp(extension, "tga") == 0)
            format = GPU_FILE_TGA;
        else
        {
            GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Could not detect output file format from file name");
            return GPU_FALSE;
        }
    }

    switch(format)
    {
    case GPU_FILE_PNG:
        result = (stbi_write_png(filename, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data, 0) > 0);
        break;
    case GPU_FILE_BMP:
        result = (stbi_write_bmp(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    case GPU_FILE_TGA:
        result = (stbi_write_tga(filename, surface->w, surface->h, surface->format->BytesPerPixel, (void*)data) > 0);
        break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Unsupported output file format");
        result = GPU_FALSE;
        break;
    }

    return result;
}